

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_object_list_resize_hash(JSContext *ctx,JSObjectList *s,uint32_t new_hash_size)

{
  int iVar1;
  uint32_t *puVar2;
  ulong uVar3;
  uint32_t *puVar4;
  uint uVar5;
  
  puVar2 = (uint32_t *)js_malloc(ctx,(ulong)new_hash_size << 2);
  if (puVar2 == (uint32_t *)0x0) {
    iVar1 = -1;
  }
  else {
    (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,s->hash_table);
    s->hash_table = puVar2;
    s->hash_size = new_hash_size;
    if (new_hash_size != 0) {
      uVar3 = 0;
      do {
        puVar2[uVar3] = 0xffffffff;
        uVar3 = uVar3 + 1;
      } while (uVar3 < s->hash_size);
    }
    if (s->object_count == 0) {
      iVar1 = 0;
    }
    else {
      puVar4 = &s->object_tab->hash_next;
      iVar1 = 0;
      uVar3 = 0;
      do {
        uVar5 = *(uint32_t *)&((JSObjectListEntry *)(puVar4 + -2))->obj * 0xc5b & s->hash_size - 1;
        *puVar4 = puVar2[uVar5];
        puVar2[uVar5] = (uint32_t)uVar3;
        uVar3 = uVar3 + 1;
        puVar4 = puVar4 + 4;
      } while (uVar3 < (uint)s->object_count);
    }
  }
  return iVar1;
}

Assistant:

static int js_object_list_resize_hash(JSContext *ctx, JSObjectList *s,
                                 uint32_t new_hash_size)
{
    JSObjectListEntry *e;
    uint32_t i, h, *new_hash_table;

    new_hash_table = js_malloc(ctx, sizeof(new_hash_table[0]) * new_hash_size);
    if (!new_hash_table)
        return -1;
    js_free(ctx, s->hash_table);
    s->hash_table = new_hash_table;
    s->hash_size = new_hash_size;
    
    for(i = 0; i < s->hash_size; i++) {
        s->hash_table[i] = -1;
    }
    for(i = 0; i < s->object_count; i++) {
        e = &s->object_tab[i];
        h = js_object_list_get_hash(e->obj, s->hash_size); 
        e->hash_next = s->hash_table[h];
        s->hash_table[h] = i;
    }
    return 0;
}